

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

int yy_reserved(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos644;
  int yypos644;
  int yythunkpos614;
  int yypos614;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchString(G,"True");
  if (iVar4 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar4 = yymatchString(G,"False");
    if (iVar4 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar4 = yymatchString(G,"pi");
      if (iVar4 == 0) {
        G->pos = iVar5;
        G->thunkpos = iVar3;
        iVar4 = yymatchString(G,"my");
        if (iVar4 == 0) {
          G->pos = iVar5;
          G->thunkpos = iVar3;
          iVar4 = yymatchString(G,"our");
          if (iVar4 == 0) {
            G->pos = iVar5;
            G->thunkpos = iVar3;
            iVar4 = yymatchString(G,"until");
            if (iVar4 == 0) {
              G->pos = iVar5;
              G->thunkpos = iVar3;
              iVar4 = yymatchString(G,"while");
              if (iVar4 == 0) {
                G->pos = iVar5;
                G->thunkpos = iVar3;
                iVar4 = yymatchString(G,"unless");
                if (iVar4 == 0) {
                  G->pos = iVar5;
                  G->thunkpos = iVar3;
                  iVar4 = yymatchString(G,"if");
                  if (iVar4 == 0) {
                    G->pos = iVar5;
                    G->thunkpos = iVar3;
                    iVar4 = yymatchString(G,"elsif");
                    if (iVar4 == 0) {
                      G->pos = iVar5;
                      G->thunkpos = iVar3;
                      iVar4 = yymatchString(G,"else");
                      if (iVar4 == 0) {
                        G->pos = iVar5;
                        G->thunkpos = iVar3;
                        iVar4 = yymatchString(G,"role");
                        if (iVar4 == 0) {
                          G->pos = iVar5;
                          G->thunkpos = iVar3;
                          iVar4 = yymatchString(G,"class");
                          if (iVar4 == 0) {
                            G->pos = iVar5;
                            G->thunkpos = iVar3;
                            iVar4 = yymatchString(G,"try");
                            if (iVar4 == 0) {
                              G->pos = iVar5;
                              G->thunkpos = iVar3;
                              iVar4 = yymatchString(G,"has");
                              if (iVar4 == 0) {
                                G->pos = iVar5;
                                G->thunkpos = iVar3;
                                iVar4 = yymatchString(G,"sub");
                                if (iVar4 == 0) {
                                  G->pos = iVar5;
                                  G->thunkpos = iVar3;
                                  iVar4 = yymatchString(G,"cmp");
                                  if (iVar4 == 0) {
                                    G->pos = iVar5;
                                    G->thunkpos = iVar3;
                                    iVar4 = yymatchString(G,"enum");
                                    if (iVar4 == 0) {
                                      G->pos = iVar5;
                                      G->thunkpos = iVar3;
                                      iVar4 = yymatchChar(G,0x65);
                                      if (iVar4 == 0) {
                                        G->pos = iVar5;
                                        G->thunkpos = iVar3;
                                        iVar4 = yymatchString(G,"time");
                                        if (iVar4 == 0) {
                                          G->pos = iVar5;
                                          G->thunkpos = iVar3;
                                          iVar4 = yymatchString(G,"now");
                                          if (iVar4 == 0) {
                                            G->pos = iVar5;
                                            G->thunkpos = iVar3;
                                            iVar4 = yymatchString(G,"rand");
                                            if (iVar4 == 0) {
                                              G->pos = iVar5;
                                              G->thunkpos = iVar3;
                                              iVar4 = yymatchString(G,"END");
                                              if (iVar4 == 0) {
                                                G->pos = iVar5;
                                                G->thunkpos = iVar3;
                                                iVar4 = yymatchString(G,"BEGIN");
                                                if (iVar4 == 0) {
                                                  G->pos = iVar5;
                                                  G->thunkpos = iVar3;
                                                  iVar4 = yymatchChar(G,0x5a);
                                                  if (iVar4 == 0) {
                                                    G->pos = iVar5;
                                                    G->thunkpos = iVar3;
                                                    iVar4 = yymatchString(G,"so");
                                                    if (iVar4 == 0) {
                                                      G->pos = iVar5;
                                                      G->thunkpos = iVar3;
                                                      iVar4 = yymatchString(G,"not");
                                                      if (iVar4 == 0) {
                                                        G->pos = iVar5;
                                                        G->thunkpos = iVar3;
                                                        iVar4 = yymatchString(G,"andthen");
                                                        if (iVar4 == 0) {
                                                          G->pos = iVar5;
                                                          G->thunkpos = iVar3;
                                                          iVar4 = yymatchString(G,"and");
                                                          if (iVar4 == 0) {
                                                            G->pos = iVar5;
                                                            G->thunkpos = iVar3;
                                                            iVar5 = yymatchString(G,"or");
                                                            if (iVar5 == 0) goto LAB_0010fa94;
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchClass(G,(uchar *)"","-A-Za-z0-9");
  if (iVar4 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    return 1;
  }
LAB_0010fa94:
  G->pos = iVar1;
  G->thunkpos = iVar2;
  return 0;
}

Assistant:

YY_RULE(int) yy_reserved(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "reserved"));

  {  int yypos614= G->pos, yythunkpos614= G->thunkpos;  if (!yymatchString(G, "True")) goto l615;
  goto l614;
  l615:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "False")) goto l616;
  goto l614;
  l616:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "pi")) goto l617;
  goto l614;
  l617:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "my")) goto l618;
  goto l614;
  l618:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "our")) goto l619;
  goto l614;
  l619:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "until")) goto l620;
  goto l614;
  l620:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "while")) goto l621;
  goto l614;
  l621:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "unless")) goto l622;
  goto l614;
  l622:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "if")) goto l623;
  goto l614;
  l623:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "elsif")) goto l624;
  goto l614;
  l624:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "else")) goto l625;
  goto l614;
  l625:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "role")) goto l626;
  goto l614;
  l626:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "class")) goto l627;
  goto l614;
  l627:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "try")) goto l628;
  goto l614;
  l628:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "has")) goto l629;
  goto l614;
  l629:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "sub")) goto l630;
  goto l614;
  l630:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "cmp")) goto l631;
  goto l614;
  l631:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "enum")) goto l632;
  goto l614;
  l632:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchChar(G, 'e')) goto l633;
  goto l614;
  l633:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "time")) goto l634;
  goto l614;
  l634:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "now")) goto l635;
  goto l614;
  l635:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "rand")) goto l636;
  goto l614;
  l636:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "END")) goto l637;
  goto l614;
  l637:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "BEGIN")) goto l638;
  goto l614;
  l638:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchChar(G, 'Z')) goto l639;
  goto l614;
  l639:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "so")) goto l640;
  goto l614;
  l640:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "not")) goto l641;
  goto l614;
  l641:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "andthen")) goto l642;
  goto l614;
  l642:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "and")) goto l643;
  goto l614;
  l643:;	  G->pos= yypos614; G->thunkpos= yythunkpos614;  if (!yymatchString(G, "or")) goto l613;

  }
  l614:;	
  {  int yypos644= G->pos, yythunkpos644= G->thunkpos;  if (!yymatchClass(G, (const unsigned char *)"\000\000\000\000\000\040\377\003\376\377\377\007\376\377\377\007\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000\000", "-A-Za-z0-9")) goto l644;
  goto l613;
  l644:;	  G->pos= yypos644; G->thunkpos= yythunkpos644;
  }  yyprintf((stderr, "  ok   reserved"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l613:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "reserved"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}